

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O3

void sub0_ctx_close(void *arg)

{
  nni_aio *aio;
  nni_mtx *mtx;
  nni_list *list;
  
  mtx = (nni_mtx *)(*(long *)((long)arg + 0x10) + 0xd8);
  nni_mtx_lock(mtx);
  list = (nni_list *)((long)arg + 0x30);
  aio = (nni_aio *)nni_list_first(list);
  while (aio != (nni_aio *)0x0) {
    nni_list_remove(list,aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    aio = (nni_aio *)nni_list_first(list);
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
sub0_ctx_close(void *arg)
{
	sub0_ctx  *ctx  = arg;
	sub0_sock *sock = ctx->sock;
	nni_aio   *aio;

	nni_mtx_lock(&sock->lk);
	while ((aio = nni_list_first(&ctx->recv_queue)) != NULL) {
		nni_list_remove(&ctx->recv_queue, aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}
	nni_mtx_unlock(&sock->lk);
}